

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O3

int __thiscall bdHashSet::printHashSet(bdHashSet *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Self __tmp;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree_node_base *local_60;
  time_t local_58;
  string local_50;
  
  local_58 = time((time_t *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Hash: ",6);
  bdStdPrintNodeId(out,&this->mId);
  cVar2 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  p_Var4 = (this->mEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60 = &(this->mEntries)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var4 != local_60) {
    paVar1 = &local_c0.field_2;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"\tK:",3);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,*(long *)(p_Var4 + 1),
                 (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
      bdStdConvertToPrintable(&local_c0,&local_80);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out," V:",3);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,*(long *)(p_Var4 + 2),
                 (long)&(p_Var4[2]._M_parent)->_M_color + *(long *)(p_Var4 + 2));
      bdStdConvertToPrintable(&local_c0,&local_a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out," A:",3);
      poVar3 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," L:",3);
      std::ostream::_M_insert<long>((long)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(out," S:",3);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,p_Var4[3]._M_parent,
                 (long)&(p_Var4[3]._M_parent)->_M_color + (long)&(p_Var4[3]._M_left)->_M_color);
      bdStdConvertToPrintable(&local_c0,&local_50);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != local_60);
  }
  return 1;
}

Assistant:

int	bdHashSet::printHashSet(std::ostream &out) {
	time_t now = time(NULL);
	std::multimap<std::string, bdHashEntry>::iterator it;
	out << "Hash: ";
	bdStdPrintNodeId(out, &mId); // Allowing "Std" as we dont need dht functions everywhere.
	out << std::endl;

	for (it = mEntries.begin(); it != mEntries.end();it++) {
		time_t age = now - it->second.mStoreTS;
		out << "\tK:" << bdStdConvertToPrintable(it->first);
		out << " V:" << bdStdConvertToPrintable(it->second.mValue);
		out << " A:" << age << " L:" << it->second.mLifetime;
		out << " S:" << bdStdConvertToPrintable(it->second.mSecret);
		out << std::endl;
	}
	return 1;
}